

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

longlong __thiscall mkvparser::Cluster::GetTimeCode(Cluster *this)

{
  longlong lVar1;
  long len;
  longlong pos;
  long lStack_18;
  longlong local_10;
  
  lVar1 = Load(this,&local_10,&lStack_18);
  if (-1 < lVar1) {
    lVar1 = this->m_timecode;
  }
  return lVar1;
}

Assistant:

long long Cluster::GetTimeCode() const {
  long long pos;
  long len;

  const long status = Load(pos, len);

  if (status < 0)  // error
    return status;

  return m_timecode;
}